

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# D3MFExporter.cpp
# Opt level: O3

void __thiscall Assimp::D3MF::D3MFExporter::~D3MFExporter(D3MFExporter *this)

{
  OpcPackageRelationship *pOVar1;
  pointer pcVar2;
  pointer puVar3;
  pointer ppOVar4;
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  *paVar5;
  pointer ppOVar6;
  ulong uVar7;
  
  ppOVar6 = (this->mRelations).
            super__Vector_base<Assimp::D3MF::OpcPackageRelationship_*,_std::allocator<Assimp::D3MF::OpcPackageRelationship_*>_>
            ._M_impl.super__Vector_impl_data._M_start;
  ppOVar4 = (this->mRelations).
            super__Vector_base<Assimp::D3MF::OpcPackageRelationship_*,_std::allocator<Assimp::D3MF::OpcPackageRelationship_*>_>
            ._M_impl.super__Vector_impl_data._M_finish;
  if (ppOVar4 != ppOVar6) {
    uVar7 = 0;
    do {
      pOVar1 = ppOVar6[uVar7];
      if (pOVar1 != (OpcPackageRelationship *)0x0) {
        pcVar2 = (pOVar1->target)._M_dataplus._M_p;
        paVar5 = &(pOVar1->target).field_2;
        if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
             *)pcVar2 != paVar5) {
          operator_delete(pcVar2,paVar5->_M_allocated_capacity + 1);
        }
        pcVar2 = (pOVar1->type)._M_dataplus._M_p;
        paVar5 = &(pOVar1->type).field_2;
        if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
             *)pcVar2 != paVar5) {
          operator_delete(pcVar2,paVar5->_M_allocated_capacity + 1);
        }
        pcVar2 = (pOVar1->id)._M_dataplus._M_p;
        paVar5 = &(pOVar1->id).field_2;
        if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
             *)pcVar2 != paVar5) {
          operator_delete(pcVar2,paVar5->_M_allocated_capacity + 1);
        }
      }
      operator_delete(pOVar1,0x60);
      uVar7 = uVar7 + 1;
      ppOVar6 = (this->mRelations).
                super__Vector_base<Assimp::D3MF::OpcPackageRelationship_*,_std::allocator<Assimp::D3MF::OpcPackageRelationship_*>_>
                ._M_impl.super__Vector_impl_data._M_start;
      ppOVar4 = (this->mRelations).
                super__Vector_base<Assimp::D3MF::OpcPackageRelationship_*,_std::allocator<Assimp::D3MF::OpcPackageRelationship_*>_>
                ._M_impl.super__Vector_impl_data._M_finish;
    } while (uVar7 < (ulong)((long)ppOVar4 - (long)ppOVar6 >> 3));
  }
  if (ppOVar4 != ppOVar6) {
    (this->mRelations).
    super__Vector_base<Assimp::D3MF::OpcPackageRelationship_*,_std::allocator<Assimp::D3MF::OpcPackageRelationship_*>_>
    ._M_impl.super__Vector_impl_data._M_finish = ppOVar6;
  }
  if (ppOVar6 != (pointer)0x0) {
    operator_delete(ppOVar6,(long)(this->mRelations).
                                  super__Vector_base<Assimp::D3MF::OpcPackageRelationship_*,_std::allocator<Assimp::D3MF::OpcPackageRelationship_*>_>
                                  ._M_impl.super__Vector_impl_data._M_end_of_storage - (long)ppOVar6
                   );
  }
  puVar3 = (this->mBuildItems).super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>.
           _M_impl.super__Vector_impl_data._M_start;
  if (puVar3 != (pointer)0x0) {
    operator_delete(puVar3,(long)(this->mBuildItems).
                                 super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>.
                                 _M_impl.super__Vector_impl_data._M_end_of_storage - (long)puVar3);
  }
  std::__cxx11::ostringstream::~ostringstream((ostringstream *)&this->mContentOutput);
  std::ios_base::~ios_base((ios_base *)&this->field_0x390);
  std::__cxx11::ostringstream::~ostringstream((ostringstream *)&this->mRelOutput);
  std::ios_base::~ios_base((ios_base *)&this->field_0x218);
  std::__cxx11::ostringstream::~ostringstream((ostringstream *)&this->mModelOutput);
  std::ios_base::~ios_base((ios_base *)&this->field_0xa0);
  pcVar2 = (this->mArchiveName)._M_dataplus._M_p;
  paVar5 = &(this->mArchiveName).field_2;
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)pcVar2 != paVar5) {
    operator_delete(pcVar2,paVar5->_M_allocated_capacity + 1);
    return;
  }
  return;
}

Assistant:

D3MFExporter::~D3MFExporter() {
    for ( size_t i = 0; i < mRelations.size(); ++i ) {
        delete mRelations[ i ];
    }
    mRelations.clear();
}